

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

optional<tinyusdz::ascii::AsciiParser::VariableDef> * __thiscall
tinyusdz::ascii::AsciiParser::GetStageMetaDefinition
          (optional<tinyusdz::ascii::AsciiParser::VariableDef> *__return_storage_ptr__,
          AsciiParser *this,string *name)

{
  size_type sVar1;
  mapped_type *value;
  
  sVar1 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
          ::count(&this->_supported_stage_metas,name);
  if (sVar1 == 0) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x60) = 0;
  }
  else {
    value = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
            ::at(&this->_supported_stage_metas,name);
    nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
    optional<tinyusdz::ascii::AsciiParser::VariableDef_&,_0>(__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<AsciiParser::VariableDef> AsciiParser::GetStageMetaDefinition(
    const std::string &name) {
  if (_supported_stage_metas.count(name)) {
    return _supported_stage_metas.at(name);
  }

  return nonstd::nullopt;
}